

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_> * __thiscall
ChatModel::line(vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_> *__return_storage_ptr__,
               ChatModel *this,int index,int width)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  int64_t seconds;
  int local_34c [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  int local_320 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  uint local_2ec [2];
  alignment local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  uint local_2bc;
  alignment local_2b8;
  byte local_2b3;
  allocator<char> local_2b2;
  byte local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  uint local_24c [2];
  alignment local_244;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  uint local_21c;
  alignment local_218;
  byte local_213;
  allocator<char> local_212;
  byte local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  uint local_1ac [2];
  alignment local_1a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  uint local_17c;
  alignment local_178;
  uint local_174 [2];
  alignment local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  uint local_148;
  alignment local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  uint local_11c [2];
  alignment local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  uint local_ec;
  alignment local_e8;
  uint local_e4 [2];
  alignment local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint local_b4;
  alignment local_b0 [4];
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c [3];
  const_reference local_30;
  value_type *msg;
  int local_20;
  int local_1c;
  int width_local;
  int index_local;
  ChatModel *this_local;
  vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_> *result;
  
  msg._7_1_ = 0;
  local_20 = width;
  local_1c = index;
  _width_local = this;
  this_local = (ChatModel *)__return_storage_ptr__;
  std::vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_>::vector(__return_storage_ptr__);
  if ((-1 < local_1c) &&
     (uVar1 = (ulong)local_1c,
     sVar2 = std::vector<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>::size
                       (&this->_chat), uVar1 < sVar2)) {
    local_30 = std::vector<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>::operator[]
                         (&this->_chat,(long)local_1c);
    local_3c[2] = 0;
    local_3c[1] = 10;
    local_3c[0] = 0;
    relive::formattedDuration_abi_cxx11_(&local_a0,(relive *)(long)local_30->_time,seconds);
    std::operator+(&local_80,"[",&local_a0);
    std::operator+(&local_60,&local_80,"]");
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)(local_3c + 2),local_3c + 1,local_3c,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    switch(local_30->_type) {
    case eMe:
    case eMode:
    case eKick:
      local_b0[0] = eRight;
      local_b4 = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_d8,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 local_b0,&this->_nickLen,&local_b4,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      local_dc = eLeft;
      local_e4[1] = 0;
      local_e4[0] = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&local_30->_strings);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string_const&>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_dc,(int *)(local_e4 + 1),local_e4,pvVar3);
      break;
    case eJoin:
      local_144 = eRight;
      local_148 = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_168,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_144,&this->_nickLen,&local_148,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      local_16c = eLeft;
      local_174[1] = 0;
      local_174[0] = 0x200000;
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,char_const(&)[23]>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_16c,(int *)(local_174 + 1),local_174,(char (*) [23])"has joined the channel"
                );
      break;
    case eLeave:
      local_178 = eRight;
      local_17c = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_1a0,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_178,&this->_nickLen,&local_17c,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      local_1a4 = eLeft;
      local_1ac[1] = 0;
      local_1ac[0] = 0x200000;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_30->_strings);
      local_211 = 0;
      local_213 = 0;
      if (sVar2 < 2) {
        std::allocator<char>::allocator();
        local_213 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_212);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_30->_strings,1);
        std::operator+(&local_210,"(",pvVar3);
        local_211 = 1;
        std::operator+(&local_1f0,&local_210,")");
      }
      std::operator+(&local_1d0,"has left the channel ",&local_1f0);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_1a4,(int *)(local_1ac + 1),local_1ac,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      if ((local_213 & 1) != 0) {
        std::allocator<char>::~allocator(&local_212);
      }
      if ((local_211 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_210);
      }
      break;
    case eQuit:
      local_218 = eRight;
      local_21c = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_240,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_218,&this->_nickLen,&local_21c,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      local_244 = eLeft;
      local_24c[1] = 0;
      local_24c[0] = 0x200000;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_30->_strings);
      local_2b1 = 0;
      local_2b3 = 0;
      if (sVar2 < 2) {
        std::allocator<char>::allocator();
        local_2b3 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_2b2);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_30->_strings,1);
        std::operator+(&local_2b0,"(",pvVar3);
        local_2b1 = 1;
        std::operator+(&local_290,&local_2b0,")");
      }
      std::operator+(&local_270,"has quit ",&local_290);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_244,(int *)(local_24c + 1),local_24c,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      if ((local_2b3 & 1) != 0) {
        std::allocator<char>::~allocator(&local_2b2);
      }
      if ((local_2b1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2b0);
      }
      break;
    case eNick:
      local_e8 = eRight;
      local_ec = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_110,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_e8,&this->_nickLen,&local_ec,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      local_114 = eLeft;
      local_11c[1] = 0;
      local_11c[0] = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&local_30->_strings);
      std::operator+(&local_140,"is now known as ",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_114,(int *)(local_11c + 1),local_11c,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      break;
    case eTopic:
      local_2b8 = eRight;
      local_2bc = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&local_30->_strings);
      std::operator+(&local_2e0,"*",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_2b8,&this->_nickLen,&local_2bc,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      local_2e4 = eLeft;
      local_2ec[1] = 0;
      local_2ec[0] = 0x200000;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&local_30->_strings);
      std::operator+(&local_310,"has changed the topic to: ",pvVar3);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 &local_2e4,(int *)(local_2ec + 1),local_2ec,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      break;
    default:
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_30->_strings);
      if (sVar2 == 1) {
        local_320[3] = 2;
        local_320[2] = 0;
        std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
        emplace_back<ghc::cui::cell::alignment,int_const&,int,char_const(&)[1]>
                  ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                   (alignment *)(local_320 + 3),&this->_nickLen,local_320 + 2,(char (*) [1])0x2c1ab7
                  );
      }
      else {
        local_320[1] = 2;
        local_320[0] = 0;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front(&local_30->_strings);
        std::operator+(&local_340,pvVar3,":");
        std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
        emplace_back<ghc::cui::cell::alignment,int_const&,int,std::__cxx11::string>
                  ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                   (alignment *)(local_320 + 1),&this->_nickLen,local_320,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
      }
      local_34c[2] = 0;
      local_34c[1] = 0;
      local_34c[0] = 0;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&local_30->_strings);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int,int,std::__cxx11::string_const&>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 (alignment *)(local_34c + 2),local_34c + 1,local_34c,pvVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ghc::cui::cell> line(int index, int width) const override
    {
        std::vector<ghc::cui::cell> result;
        if(index >= 0 && index < _chat.size()) {
            const auto& msg = _chat[index];
            result.emplace_back(ghc::cui::cell::eLeft, 10, 0, "[" + formattedDuration(msg._time) + "]");
            switch(msg._type) {
                case ChatMessage::eMe:
                case ChatMessage::eMode:
                case ChatMessage::eKick:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD,  msg._strings.back());
                    break;
                case ChatMessage::eNick:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "is now known as " + msg._strings.back());
                    break;
                case ChatMessage::eJoin:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has joined the channel");
                    break;
                case ChatMessage::eLeave:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has left the channel " + (msg._strings.size()>1 ? "("+msg._strings[1]+")":""));
                    break;
                case ChatMessage::eQuit:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has quit " + (msg._strings.size()>1 ? "("+msg._strings[1]+")":""));
                    break;
                case ChatMessage::eTopic:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has changed the topic to: " + msg._strings.back());
                    break;
                default:
                    if(msg._strings.size() == 1) {
                        result.emplace_back(ghc::cui::cell::eRight, _nickLen, 0, "");
                    }
                    else {
                        result.emplace_back(ghc::cui::cell::eRight, _nickLen, 0, msg._strings.front()+":");
                    }
                    result.emplace_back(ghc::cui::cell::eLeft, 0, 0, msg._strings.back());
                    break;
            }
        }
        return result;
    }